

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32 png_get_hIST(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_16p *hist)

{
  png_uint_16p *hist_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_inforp)0x0)) ||
      ((info_ptr->valid & 0x40) == 0)) || (hist == (png_uint_16p *)0x0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    *hist = info_ptr->hist;
    png_ptr_local._4_4_ = 0x40;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_hIST(png_const_structrp png_ptr, png_inforp info_ptr,
    png_uint_16p *hist)
{
   png_debug1(1, "in %s retrieval function", "hIST");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_hIST) != 0 && hist != NULL)
   {
      *hist = info_ptr->hist;
      return (PNG_INFO_hIST);
   }

   return (0);
}